

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to4.h
# Opt level: O1

void ncnn::convolution_im2col_sgemm_transform_kernel_pack16to4_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  undefined4 *puVar8;
  ulong uVar9;
  uint _w;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  undefined4 *puVar13;
  undefined4 *puVar14;
  void *pvVar15;
  undefined4 *puVar16;
  int i_1;
  int i;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong local_b8;
  Mat local_88;
  long local_38;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_88,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar7 = inch + 0xf;
  if (-1 < inch) {
    iVar7 = inch;
  }
  iVar4 = outch + 0xf;
  if (-1 < outch) {
    iVar4 = outch;
  }
  auVar19 = vpbroadcastd_avx512vl();
  auVar20 = vpsrad_avx(auVar19,0x1f);
  auVar20 = vpsrlvd_avx2(auVar20,_DAT_00551030);
  auVar20 = vpaddd_avx(auVar19,auVar20);
  auVar21._8_8_ = 0xfffffff8fffffff0;
  auVar21._0_8_ = 0xfffffff8fffffff0;
  auVar20 = vpandq_avx512vl(auVar20,auVar21);
  auVar20 = vpsubd_avx(auVar19,auVar20);
  auVar21 = vpsrad_avx(auVar20,0x1f);
  auVar21 = vpsrlvd_avx2(auVar21,_DAT_00551050);
  auVar20 = vpaddd_avx(auVar20,auVar21);
  auVar20 = vpsravd_avx2(auVar20,_DAT_00551060);
  Mat::create(kernel_tm,_w * 0x100,iVar7 >> 4,auVar20._4_4_ + auVar20._0_4_ + (iVar4 >> 4),4,
              (Allocator *)0x0);
  lVar5 = (long)inch;
  uVar6 = (ulong)_w;
  uVar12 = 0;
  if (0xf < outch) {
    pvVar1 = kernel_tm->data;
    local_38 = kernel_tm->cstep * kernel_tm->elemsize;
    local_b8 = 0;
    do {
      if (0xf < inch) {
        pvVar15 = (void *)((local_b8 >> 4) * local_38 + (long)pvVar1);
        puVar13 = (undefined4 *)
                  (local_88.cstep * local_88.elemsize * local_b8 + (long)local_88.data);
        lVar10 = 0;
        do {
          if (0 < (int)_w) {
            uVar12 = 0;
            puVar8 = puVar13;
            do {
              lVar17 = 0;
              puVar14 = puVar8;
              do {
                pvVar11 = pvVar15;
                lVar18 = 0;
                puVar16 = puVar14;
                do {
                  *(undefined4 *)((long)pvVar11 + lVar18) = *puVar16;
                  puVar16 = (undefined4 *)((long)puVar16 + local_88.cstep * local_88.elemsize);
                  lVar18 = lVar18 + 4;
                } while (lVar18 != 0x40);
                lVar17 = lVar17 + 1;
                puVar14 = (undefined4 *)((long)puVar14 + (long)local_88.w * local_88.elemsize);
                pvVar15 = (void *)((long)pvVar11 + 0x40);
              } while (lVar17 != 0x10);
              uVar12 = uVar12 + 1;
              puVar8 = puVar8 + 1;
              pvVar15 = (void *)((long)pvVar11 + 0x40);
            } while (uVar12 != uVar6);
            pvVar15 = (void *)((long)pvVar11 + 0x40);
          }
          lVar17 = lVar10 + 0x1f;
          puVar13 = puVar13 + (long)local_88.w * local_88.elemsize * 4;
          lVar10 = lVar10 + 0x10;
        } while (lVar17 < lVar5);
      }
      uVar12 = local_b8 + 0x10;
      uVar9 = local_b8 + 0x1f;
      local_b8 = uVar12;
    } while (uVar9 < (uint)outch);
  }
  if ((int)((uint)uVar12 | 7) < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    uVar12 = uVar12 & 0xffffffff;
    do {
      if (0xf < inch) {
        pvVar15 = (void *)((ulong)(((uint)(uVar12 >> 4) & 0xfffffff) +
                                  (uint)(((uint)uVar12 >> 3 & 1) != 0)) * sVar2 * sVar3 +
                          (long)pvVar1);
        puVar13 = (undefined4 *)(local_88.cstep * local_88.elemsize * uVar12 + (long)local_88.data);
        lVar10 = 0;
        do {
          if (0 < (int)_w) {
            uVar9 = 0;
            puVar8 = puVar13;
            do {
              lVar17 = 0;
              puVar14 = puVar8;
              do {
                pvVar11 = pvVar15;
                lVar18 = 0;
                puVar16 = puVar14;
                do {
                  *(undefined4 *)((long)pvVar11 + lVar18) = *puVar16;
                  puVar16 = (undefined4 *)((long)puVar16 + local_88.cstep * local_88.elemsize);
                  lVar18 = lVar18 + 4;
                } while (lVar18 != 0x20);
                lVar17 = lVar17 + 1;
                puVar14 = (undefined4 *)((long)puVar14 + (long)local_88.w * local_88.elemsize);
                pvVar15 = (void *)((long)pvVar11 + 0x20);
              } while (lVar17 != 0x10);
              uVar9 = uVar9 + 1;
              puVar8 = puVar8 + 1;
              pvVar15 = (void *)((long)pvVar11 + 0x20);
            } while (uVar9 != uVar6);
            pvVar15 = (void *)((long)pvVar11 + 0x20);
          }
          lVar17 = lVar10 + 0x1f;
          puVar13 = puVar13 + (long)local_88.w * local_88.elemsize * 4;
          lVar10 = lVar10 + 0x10;
        } while (lVar17 < lVar5);
      }
      uVar12 = uVar12 + 8;
    } while ((int)((uint)uVar12 | 7) < outch);
  }
  if ((int)((uint)uVar12 | 3) < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    local_b8 = uVar12 & 0xffffffff;
    do {
      if (0xf < inch) {
        pvVar15 = (void *)((ulong)(((uint)(local_b8 >> 4) & 0xfffffff) + ((uint)(local_b8 >> 3) & 1)
                                  + (uint)(((uint)local_b8 >> 2 & 1) != 0)) * sVar2 * sVar3 +
                          (long)pvVar1);
        puVar13 = (undefined4 *)
                  (local_88.cstep * local_88.elemsize * local_b8 + (long)local_88.data);
        lVar10 = 0;
        do {
          if (0 < (int)_w) {
            uVar12 = 0;
            puVar8 = puVar13;
            do {
              lVar17 = 0;
              puVar14 = puVar8;
              do {
                pvVar11 = pvVar15;
                lVar18 = 0;
                puVar16 = puVar14;
                do {
                  *(undefined4 *)((long)pvVar11 + lVar18) = *puVar16;
                  puVar16 = (undefined4 *)((long)puVar16 + local_88.cstep * local_88.elemsize);
                  lVar18 = lVar18 + 4;
                } while (lVar18 != 0x10);
                lVar17 = lVar17 + 1;
                puVar14 = (undefined4 *)((long)puVar14 + (long)local_88.w * local_88.elemsize);
                pvVar15 = (void *)((long)pvVar11 + 0x10);
              } while (lVar17 != 0x10);
              uVar12 = uVar12 + 1;
              puVar8 = puVar8 + 1;
              pvVar15 = (void *)((long)pvVar11 + 0x10);
            } while (uVar12 != uVar6);
            pvVar15 = (void *)((long)pvVar11 + 0x10);
          }
          lVar17 = lVar10 + 0x1f;
          puVar13 = puVar13 + (long)local_88.w * local_88.elemsize * 4;
          lVar10 = lVar10 + 0x10;
        } while (lVar17 < lVar5);
      }
      local_b8 = local_b8 + 4;
    } while ((int)((uint)local_b8 | 3) < outch);
  }
  if (local_88.refcount != (int *)0x0) {
    LOCK();
    *local_88.refcount = *local_88.refcount + -1;
    UNLOCK();
    if (*local_88.refcount == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-16a-maxk-inch/16a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * 16 * maxk, inch / 16, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4, (size_t)4u);

    int q = 0;
    for (; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}